

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# particleSamples.cpp
# Opt level: O1

void __thiscall particleSamples::read_in_particle_samples_and_filter(particleSamples *this)

{
  read_in_particle_samples(this);
  filter_particles_from_events(this,this->particle_monval);
  return;
}

Assistant:

void particleSamples::read_in_particle_samples_and_filter() {
    read_in_particle_samples();

    filter_particles_from_events(particle_monval);
    // filter_particles_into_lists(full_particle_list);

    //// reconst phi(1020) from K^+ and K^- pair
    // if (reconst_flag == 1)
    //     perform_particle_reconstruction();
}